

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

Uint32 __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetStaticVariableCount
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,SHADER_TYPE ShaderType)

{
  undefined *puVar1;
  bool bVar2;
  Int32 IVar3;
  uint uVar4;
  Uint32 UVar5;
  undefined8 uVar6;
  const_reference pvVar7;
  Char *Message;
  char (*in_stack_ffffffffffffff58) [3];
  undefined1 local_88 [8];
  string msg;
  int VarMngrInd;
  Int32 ShaderTypeInd;
  char *local_50;
  Char *local_48;
  undefined1 local_40 [8];
  string _msg;
  SHADER_TYPE ShaderType_local;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  _msg.field_2._12_4_ = ShaderType;
  bVar2 = IsConsistentShaderType(ShaderType,this->m_PipelineType);
  if (bVar2) {
    IVar3 = GetShaderTypePipelineIndex(_msg.field_2._12_4_,this->m_PipelineType);
    pvVar7 = std::array<signed_char,_6UL>::operator[](&this->m_StaticResStageIndex,(long)IVar3);
    uVar4 = (uint)*pvVar7;
    if ((int)uVar4 < 0) {
      this_local._4_4_ = 0;
    }
    else {
      msg.field_2._12_4_ = uVar4;
      UVar5 = GetNumStaticResStages(this);
      if (UVar5 <= uVar4) {
        FormatString<char[26],char[58]>
                  ((string *)local_88,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages()",
                   (char (*) [58])(ulong)UVar5);
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"GetStaticVariableCount",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                   ,0x1c9);
        std::__cxx11::string::~string((string *)local_88);
      }
      this_local._4_4_ =
           ShaderVariableManagerVk::GetVariableCount
                     (this->m_StaticVarsMgrs + (int)msg.field_2._12_4_);
    }
  }
  else {
    local_48 = GetShaderTypeLiteralName(_msg.field_2._12_4_);
    local_50 = GetPipelineTypeString(this->m_PipelineType);
    FormatString<char[62],char_const*,char[30],char_const*,char[31],char_const*,char[3]>
              ((string *)local_40,
               (Diligent *)"Unable to get the number of static variables in shader stage ",
               (char (*) [62])&local_48,(char **)" as the stage is invalid for ",
               (char (*) [30])&local_50,(char **)0xcc6abc,
               (char (*) [31])
               &(this->
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                ).m_Desc,(char **)"\'.",in_stack_ffffffffffffff58);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar6 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar6,0);
    }
    std::__cxx11::string::~string((string *)local_40);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

GetStaticVariableCount(SHADER_TYPE ShaderType) const override final
    {
        if (!IsConsistentShaderType(ShaderType, m_PipelineType))
        {
            LOG_WARNING_MESSAGE("Unable to get the number of static variables in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is invalid for ", GetPipelineTypeString(m_PipelineType), " pipeline resource signature '", this->m_Desc.Name, "'.");
            return 0;
        }

        const Int32 ShaderTypeInd = GetShaderTypePipelineIndex(ShaderType, m_PipelineType);
        const int   VarMngrInd    = m_StaticResStageIndex[ShaderTypeInd];
        if (VarMngrInd < 0)
            return 0;

        VERIFY_EXPR(static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages());
        return m_StaticVarsMgrs[VarMngrInd].GetVariableCount();
    }